

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::BitSet::get(BitSet *this,XMLSize_t index)

{
  bool local_29;
  bool retVal;
  XMLSize_t bitWithinUnit;
  XMLSize_t unitOfBit;
  XMLSize_t index_local;
  BitSet *this_local;
  
  local_29 = false;
  if (index >> 5 <= this->fUnitLen) {
    local_29 = (this->fBits[index >> 5] & (long)(1 << ((byte)index & 0x1f))) != 0;
  }
  return local_29;
}

Assistant:

bool BitSet::get(const XMLSize_t index) const
{
    const XMLSize_t unitOfBit = (index / kBitsPerUnit);
    const XMLSize_t bitWithinUnit = index % kBitsPerUnit;

    //
    //  If the index is beyond our size, don't actually expand. Just return
    //  false, which is what the state would be if we did expand it.
    //
    bool retVal = false;
    if (unitOfBit <= fUnitLen)
    {
        if (fBits[unitOfBit] & (1 << bitWithinUnit))
            retVal = true;
    }
    return retVal;
}